

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O3

void amrex::VisMF::AsyncWrite(FabArray<amrex::FArrayBox> *mf,string *mf_name,bool valid_cells_only)

{
  bool bVar1;
  FabArray<amrex::FArrayBox> mf_tmp;
  FabFactory<amrex::FArrayBox> local_1e0;
  MFInfo local_1d8;
  IntVect local_1ac;
  FabArray<amrex::FArrayBox> local_1a0;
  
  bVar1 = AsyncOut::UseAsyncOut();
  if (bVar1) {
    AsyncWriteDoit(mf,mf_name,true,valid_cells_only);
    return;
  }
  if ((valid_cells_only) &&
     ((*(long *)(mf->super_FabArrayBase).n_grow.vect != 0 ||
      ((mf->super_FabArrayBase).n_grow.vect[2] != 0)))) {
    local_1d8.alloc = true;
    local_1d8._1_7_ = 0;
    local_1d8.arena = (Arena *)0x0;
    local_1d8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e0._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0080b918;
    local_1ac.vect[0] = 0;
    local_1ac.vect[1] = 0;
    local_1ac.vect[2] = 0;
    FabArray<amrex::FArrayBox>::FabArray
              (&local_1a0,&(mf->super_FabArrayBase).boxarray,
               &(mf->super_FabArrayBase).distributionMap,(mf->super_FabArrayBase).n_comp,&local_1ac,
               &local_1d8,&local_1e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    local_1d8.alloc = false;
    local_1d8._1_7_ = 0;
    local_1d8.arena = (Arena *)((ulong)local_1d8.arena & 0xffffffff00000000);
    Copy<amrex::FArrayBox,void>
              (&local_1a0,mf,0,0,(mf->super_FabArrayBase).n_comp,(IntVect *)&local_1d8);
    Write(&local_1a0,mf_name,NFiles,false);
    FabArray<amrex::FArrayBox>::~FabArray(&local_1a0);
    return;
  }
  Write(mf,mf_name,NFiles,false);
  return;
}

Assistant:

void
VisMF::AsyncWrite (FabArray<FArrayBox>&& mf, const std::string& mf_name, bool valid_cells_only)
{
    if (AsyncOut::UseAsyncOut()) {
        AsyncWriteDoit(mf, mf_name, true, valid_cells_only);
    } else {
        if (valid_cells_only && mf.nGrowVect() != 0) {
            FabArray<FArrayBox> mf_tmp(mf.boxArray(), mf.DistributionMap(), mf.nComp(), 0);
            amrex::Copy(mf_tmp, mf, 0, 0, mf.nComp(), 0);
            Write(mf_tmp, mf_name);
        } else {
            Write(mf, mf_name);
        }
    }
}